

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4d5f50::InlineImageTracker::handleToken(InlineImageTracker *this,Token *token)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  QPDF *qpdf;
  element_type *peVar2;
  InlineImageTracker *this_00;
  bool bVar3;
  iterator iVar4;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t in_RCX;
  int *min_suffix;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  element_type *this_01;
  string name_1;
  QPDFObjectHandle value;
  QPDFObjectHandle colorspace;
  string name;
  QPDFObjectHandle image;
  QPDFObjectHandle dict;
  size_t len;
  string image_data;
  _Alloc_hider local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffea8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_140;
  allocator<char> local_12a;
  allocator<char> local_129;
  undefined1 local_128 [24];
  string local_110;
  string local_f0;
  QPDFObjectHandle local_d0;
  string *local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_a8;
  InlineImageTracker *local_88;
  _Base_ptr local_80;
  undefined1 local_78 [32];
  ulong local_58;
  string local_50 [8];
  ulong local_48;
  
  if (this->state == st_bi) {
    if (token->type == tt_inline_image) {
      std::__cxx11::string::string(local_50,(string *)&token->value);
      local_58 = local_48;
      if (local_48 < this->min_size) {
        QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)this + 0x50,__buf,in_RCX)
        ;
        QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
        this->state = st_top;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_12a);
        QPDFObjectHandle::parse((QPDFObjectHandle *)(local_78 + 0x10),&this->dict_str,&local_a8);
        QPDFObjectHandle::newDictionary();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_128 + 0x18),"/Type",(allocator<char> *)local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"/XObject",(allocator<char> *)&local_b8);
        QPDFObjectHandle::newName(&local_f0);
        QPDFObjectHandle::replaceKey
                  (&local_d0,(string *)(local_128 + 0x18),(QPDFObjectHandle *)&local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)(local_128 + 0x18));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_128 + 0x18),"/Subtype",(allocator<char> *)local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"/Image",(allocator<char> *)&local_b8);
        QPDFObjectHandle::newName(&local_f0);
        QPDFObjectHandle::replaceKey
                  (&local_d0,(string *)(local_128 + 0x18),(QPDFObjectHandle *)&local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)(local_128 + 0x18));
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10));
        iVar4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_b8);
        local_80 = (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_b8);
        local_c0 = (string *)&this->resources;
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_128 + 0x18);
        local_88 = this;
        for (; iVar4._M_node != local_80;
            iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
          bVar3 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar4._M_node + 2));
          if (!bVar3) {
            std::__cxx11::string::string((string *)__lhs,(string *)(iVar4._M_node + 1));
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_140,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar4._M_node + 2));
            bVar3 = std::operator==(__lhs,"/BPC");
            if (((((bVar3) || (bVar3 = std::operator==(__lhs,"/CS"), bVar3)) ||
                 (bVar3 = std::operator==(__lhs,"/D"), bVar3)) ||
                (((bVar3 = std::operator==(__lhs,"/DP"), bVar3 ||
                  (bVar3 = std::operator==(__lhs,"/F"), bVar3)) ||
                 ((bVar3 = std::operator==(__lhs,"/H"), bVar3 ||
                  ((bVar3 = std::operator==(__lhs,"/IM"), bVar3 ||
                   (bVar3 = std::operator==(__lhs,"/I"), bVar3)))))))) ||
               (bVar3 = std::operator==(__lhs,"/W"), bVar3)) {
              std::__cxx11::string::assign((char *)__lhs);
            }
            bVar3 = std::operator==(__lhs,"/ColorSpace");
            if (bVar3) {
              bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)&local_140);
              if (bVar3) {
                QPDFObjectHandle::getName_abi_cxx11_
                          ((string *)&local_160,(QPDFObjectHandle *)&local_140);
                bVar3 = std::operator==((string *)&local_160,"/G");
                if ((((bVar3) || (bVar3 = std::operator==((string *)&local_160,"/RGB"), bVar3)) ||
                    (bVar3 = std::operator==((string *)&local_160,"/CMYK"), bVar3)) ||
                   (bVar3 = std::operator==((string *)&local_160,"/I"), bVar3)) {
                  std::__cxx11::string::assign((char *)&local_160);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_f0,"/ColorSpace",&local_129);
                  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_128,local_c0);
                  std::__cxx11::string::~string((string *)&local_f0);
                  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_128);
                  if ((bVar3) &&
                     (bVar3 = QPDFObjectHandle::hasKey
                                        ((QPDFObjectHandle *)local_128,(string *)&local_160), bVar3)
                     ) {
                    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_f0,(string *)local_128);
                    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                              (&local_140,
                               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_f0);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &local_f0._M_string_length);
                  }
                  else {
                    std::operator+(&local_f0,"unable to resolve colorspace ",(string *)&local_160);
                    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_c0,&local_f0);
                    std::__cxx11::string::~string((string *)&local_f0);
                  }
                  in_stack_fffffffffffffea8._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  *local_160._M_p = '\0';
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
                }
                if (in_stack_fffffffffffffea8._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  QPDFObjectHandle::newName(&local_f0);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_140,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_f0);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_f0._M_string_length);
                }
                std::__cxx11::string::~string((string *)&local_160);
              }
            }
            else {
              bVar3 = std::operator==(__lhs,"/Filter");
              if (bVar3) {
                local_128._0_8_ = (element_type *)0x0;
                local_128._8_8_ = (element_type *)0x0;
                local_128._16_8_ = (pointer)0x0;
                bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)&local_140);
                if (bVar3) {
                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                             local_128,(value_type *)&local_140);
                  this_01 = (element_type *)local_128._0_8_;
                  peVar2 = (element_type *)local_128._8_8_;
                }
                else {
                  bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_140);
                  this_01 = (element_type *)local_128._0_8_;
                  peVar2 = (element_type *)local_128._8_8_;
                  if (bVar3) {
                    QPDFObjectHandle::getArrayAsVector
                              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               &local_160,(QPDFObjectHandle *)&local_140);
                    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_move_assign
                              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               local_128);
                    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               &local_160);
                    this_01 = (element_type *)local_128._0_8_;
                    peVar2 = (element_type *)local_128._8_8_;
                  }
                }
                for (; this_01 != peVar2;
                    this_01 = (element_type *)
                              ((long)&(this_01->value).
                                      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                      .
                                      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                      .
                                      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                      .
                                      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                      .
                                      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                      .
                                      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                              + 0x10)) {
                  local_160._M_p = (pointer)&local_150;
                  in_stack_fffffffffffffea8._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_150._M_local_buf[0] = '\0';
                  bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)this_01);
                  if (bVar3) {
                    QPDFObjectHandle::getName_abi_cxx11_(&local_f0,(QPDFObjectHandle *)this_01);
                    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_f0);
                    std::__cxx11::string::~string((string *)&local_f0);
                  }
                  bVar3 = std::operator==((string *)&local_160,"/AHx");
                  if (((((bVar3) || (bVar3 = std::operator==((string *)&local_160,"/A85"), bVar3))
                       || (bVar3 = std::operator==((string *)&local_160,"/LZW"), bVar3)) ||
                      ((bVar3 = std::operator==((string *)&local_160,"/Fl"), bVar3 ||
                       (bVar3 = std::operator==((string *)&local_160,"/RL"), bVar3)))) ||
                     ((bVar3 = std::operator==((string *)&local_160,"/CCF"), bVar3 ||
                      (bVar3 = std::operator==((string *)&local_160,"/DCT"), bVar3)))) {
                    std::__cxx11::string::assign((char *)&local_160);
                  }
                  else {
                    in_stack_fffffffffffffea8._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    *local_160._M_p = '\0';
                  }
                  if (in_stack_fffffffffffffea8._M_pi !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    QPDFObjectHandle::newName(&local_f0);
                    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_01,
                               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_f0);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &local_f0._M_string_length);
                  }
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)&local_140);
                if ((bVar3) && (local_128._8_8_ - local_128._0_8_ == 0x10)) {
                  p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *
                                      )local_128,0);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_140,p_Var5);
                }
                else {
                  bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_140);
                  if (bVar3) {
                    QPDFObjectHandle::newArray
                              ((QPDFObjectHandle *)&local_160,
                               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               local_128);
                    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                              (&local_140,
                               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &stack0xfffffffffffffea8);
                  }
                }
                std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                          ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_128)
                ;
              }
            }
            QPDFObjectHandle::replaceKey(&local_d0,__lhs,(QPDFObjectHandle *)&local_140);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount)
            ;
            std::__cxx11::string::~string((string *)__lhs);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x18));
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_128 + 0x18),"/Length",(allocator<char> *)&local_f0);
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_58);
        this_00 = local_88;
        psVar1 = local_c0;
        QPDFObjectHandle::newInteger((longlong)in_stack_fffffffffffffea8._M_pi);
        QPDFObjectHandle::replaceKey
                  (&local_d0,(string *)(local_128 + 0x18),(QPDFObjectHandle *)&local_160);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffea8);
        std::__cxx11::string::~string((string *)(local_128 + 0x18));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"/IIm",(allocator<char> *)&local_f0);
        min_suffix = &this_00->min_suffix;
        QPDFObjectHandle::getUniqueResourceName
                  ((string *)(local_128 + 0x18),(QPDFObjectHandle *)psVar1,(string *)&local_160,
                   min_suffix,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        std::__cxx11::string::~string((string *)&local_160);
        qpdf = this_00->qpdf;
        std::make_shared<Buffer,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        QPDFObjectHandle::newStream
                  ((QPDFObjectHandle *)&local_f0,qpdf,(shared_ptr<Buffer> *)local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
        QPDFObjectHandle::replaceDict((QPDFObjectHandle *)&local_f0,&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"/XObject",(allocator<char> *)local_128);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a8,psVar1);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&local_a8,(string *)(local_128 + 0x18),
                   (QPDFObjectHandle *)&local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
        std::__cxx11::string::~string((string *)&local_160);
        QPDFObjectHandle::TokenFilter::write
                  (&this_00->super_TokenFilter,(int)local_128 + 0x18,__buf_00,(size_t)min_suffix);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160," Do\n",(allocator<char> *)&local_a8);
        QPDFObjectHandle::TokenFilter::write
                  (&this_00->super_TokenFilter,(int)&local_160,__buf_01,(size_t)min_suffix);
        std::__cxx11::string::~string((string *)&local_160);
        this_00->any_images = true;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        std::__cxx11::string::~string((string *)(local_128 + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_d0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::__cxx11::string::~string(local_50);
    }
    else {
      psVar1 = (string *)(local_128 + 0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar1,"ID",(allocator<char> *)&local_160);
      bVar3 = QPDFTokenizer::Token::isWord(token,psVar1);
      std::__cxx11::string::~string((string *)psVar1);
      if (bVar3) {
        std::__cxx11::string::append((string *)&this->bi_str);
        std::__cxx11::string::append((char *)&this->dict_str);
      }
      else {
        psVar1 = (string *)(local_128 + 0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar1,"EI",(allocator<char> *)&local_160);
        bVar3 = QPDFTokenizer::Token::isWord(token,psVar1);
        std::__cxx11::string::~string((string *)psVar1);
        if (bVar3) {
          this->state = st_top;
        }
        else {
          std::__cxx11::string::append((string *)&this->bi_str);
          std::__cxx11::string::append((string *)&this->dict_str);
        }
      }
    }
  }
  else {
    psVar1 = (string *)(local_128 + 0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)psVar1,"BI",(allocator<char> *)&local_160);
    bVar3 = QPDFTokenizer::Token::isWord(token,psVar1);
    std::__cxx11::string::~string((string *)psVar1);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&this->bi_str);
      std::__cxx11::string::assign((char *)&this->dict_str);
      this->state = st_bi;
    }
    else {
      QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    }
  }
  return;
}

Assistant:

void
InlineImageTracker::handleToken(QPDFTokenizer::Token const& token)
{
    if (state == st_bi) {
        if (token.getType() == QPDFTokenizer::tt_inline_image) {
            std::string image_data(token.getValue());
            size_t len = image_data.length();
            if (len >= this->min_size) {
                QTC::TC("qpdf", "QPDFPageObjectHelper externalize inline image");
                QPDFObjectHandle dict = convertIIDict(QPDFObjectHandle::parse(dict_str));
                dict.replaceKey("/Length", QPDFObjectHandle::newInteger(QIntC::to_longlong(len)));
                std::string name = resources.getUniqueResourceName("/IIm", this->min_suffix);
                QPDFObjectHandle image = QPDFObjectHandle::newStream(
                    this->qpdf, std::make_shared<Buffer>(std::move(image_data)));
                image.replaceDict(dict);
                resources.getKey("/XObject").replaceKey(name, image);
                write(name);
                write(" Do\n");
                any_images = true;
            } else {
                QTC::TC("qpdf", "QPDFPageObjectHelper keep inline image");
                write(bi_str);
                writeToken(token);
                state = st_top;
            }
        } else if (token.isWord("ID")) {
            bi_str += token.getValue();
            dict_str += " >>";
        } else if (token.isWord("EI")) {
            state = st_top;
        } else {
            bi_str += token.getRawValue();
            dict_str += token.getRawValue();
        }
    } else if (token.isWord("BI")) {
        bi_str = token.getValue();
        dict_str = "<< ";
        state = st_bi;
    } else {
        writeToken(token);
    }
}